

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcMove::IfcMove(IfcMove *this)

{
  *(undefined ***)&this->field_0x1d0 = &PTR__Object_00836880;
  *(undefined8 *)&this->field_0x1d8 = 0;
  *(char **)&this->field_0x1e0 = "IfcMove";
  IfcTask::IfcTask(&this->super_IfcTask,&PTR_construction_vtable_24__008de818);
  *(undefined8 *)&(this->super_IfcTask).field_0x198 = 0;
  *(undefined8 *)&this->super_IfcTask = 0x8de710;
  *(undefined8 *)&this->field_0x1d0 = 0x8de800;
  *(undefined8 *)&(this->super_IfcTask).field_0x88 = 0x8de738;
  *(undefined8 *)&(this->super_IfcTask).field_0x98 = 0x8de760;
  *(undefined8 *)&(this->super_IfcTask).field_0xd0 = 0x8de788;
  (this->super_IfcTask).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTask,_5UL>._vptr_ObjectHelper
       = (_func_int **)0x8de7b0;
  *(undefined8 *)&(this->super_IfcTask).field_0x190 = 0x8de7d8;
  *(undefined8 *)&(this->super_IfcTask).field_0x1a0 = 0;
  (this->MoveTo).obj = (LazyObject *)0x0;
  (this->PunchList).ptr.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->PunchList).ptr.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->PunchList).ptr.
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->PunchList).ptr.
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  return;
}

Assistant:

IfcMove() : Object("IfcMove") {}